

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatbits.h
# Opt level: O0

float bits_to_float(uint32_t a)

{
  anon_union_4_2_947300a4 x;
  uint32_t a_local;
  
  return (float)a;
}

Assistant:

static inline float bits_to_float(uint32_t a)
{
  union {
    float f;
    uint32_t i;
  } x;
  x.i = a;
  return x.f;
}